

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

long GetStreamWriteAvailable(PaStream *s)

{
  int iVar1;
  long lVar2;
  char *format;
  int xrun;
  unsigned_long avail;
  int local_14;
  unsigned_long local_10;
  
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         (*(PaAlsaStreamComponent **)((long)s + 0x340),&local_10,&local_14);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4534\n"
    ;
  }
  else {
    if (local_14 == 0) {
      return local_10;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)s);
    if (-1 < paUtilErr_) {
      lVar2 = snd_pcm_avail_update(*(undefined8 *)((long)s + 0x340));
      if (-1 < (int)lVar2) {
        return lVar2;
      }
      GetStreamWriteAvailable_cold_1();
      iVar1 = -9999;
      goto LAB_0010ea46;
    }
    format = 
    "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4539\n"
    ;
  }
  PaUtil_DebugPrint(format);
  iVar1 = paUtilErr_;
LAB_0010ea46:
  return (long)iVar1;
}

Assistant:

static signed long GetStreamWriteAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun ) );
    if( xrun )
    {
        snd_pcm_sframes_t savail;

        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        savail = alsa_snd_pcm_avail_update( stream->playback.pcm );

        /* savail should not contain -EPIPE now, since PaAlsaStream_HandleXrun will only prepare the pcm */
        ENSURE_( savail, paUnanticipatedHostError );

        avail = (unsigned long) savail;
    }

    return (signed long)avail;

error:
    return result;
}